

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jansson_helper.c
# Opt level: O2

uint64_t get_uint64t_options(char *json_string,char *option_name,int *result)

{
  json_t *root;
  uint64_t uVar1;
  
  *result = -1;
  root = get_root_option_json_object(json_string);
  if (root != (json_t *)0x0) {
    uVar1 = get_int_options_inner(root,option_name,result,1);
    return uVar1;
  }
  return 0xffffffffffffffff;
}

Assistant:

uint64_t get_uint64t_options(const char * json_string, const char * option_name, int * result)
{
	json_t * root;

	*result = -1;
	root = get_root_option_json_object(json_string);
	if (!root)
		return -1;
	return (uint64_t)get_int_options_inner(root, option_name, result, 1);
}